

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O3

int inver_order(int *list,int n)

{
  int iVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  
  iVar1 = 0;
  if (1 < n) {
    iVar1 = 0;
    uVar2 = 1;
    do {
      uVar3 = 0;
      do {
        iVar1 = iVar1 + (uint)(list[uVar2] < list[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)n);
  }
  return iVar1;
}

Assistant:

int inver_order(int list[], int n) {
    int ret = 0;
    for (int i = 1; i < n; i++)
        for (int j = 0; j < i; j++)
            if (list[j] > list[i])
                ret++;
    return ret;
}